

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsSS.cpp
# Opt level: O1

int __thiscall
helics::zeromq::ZmqCommsSS::initializeConnectionToBroker
          (ZmqCommsSS *this,socket_t *brokerConnection)

{
  byte *__src;
  pointer pcVar1;
  size_type sVar2;
  size_type sVar3;
  string_view string3;
  socklen_t __len;
  sockaddr *__addr;
  int __flags;
  void *in_R8;
  socklen_t in_R9D;
  string_view string1;
  string_view string2;
  vector<char,_std::allocator<char>_> buffer;
  ActionMessage cmessage;
  vector<char,_std::allocator<char>_> local_1b8;
  string local_198 [3];
  size_t local_138;
  char *pcStack_130;
  undefined1 local_e8 [64];
  SmallBuffer local_a8;
  pointer pcVar4;
  
  zmq::detail::socket_base::setsockopt
            (&brokerConnection->super_socket_base,5,
             (int)(this->super_NetworkCommsInterface).super_CommsInterface.name._M_dataplus._M_p,
             (int)(this->super_NetworkCommsInterface).super_CommsInterface.name._M_string_length,
             in_R8,in_R9D);
  local_e8._0_4_ = cmd_time_request;
  __len = 4;
  zmq::detail::socket_base::setsockopt
            (&brokerConnection->super_socket_base,0x11,(int)local_e8,4,in_R8,in_R9D);
  gmlc::networking::makePortAddress
            ((string *)local_e8,
             &(this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress,
             (this->super_NetworkCommsInterface).brokerPort);
  zmq::detail::socket_base::connect
            (&brokerConnection->super_socket_base,local_e8._0_4_,__addr,__len);
  if ((undefined1 *)CONCAT44(local_e8._4_4_,local_e8._0_4_) != local_e8 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_e8._4_4_,local_e8._0_4_),local_e8._16_8_ + 1);
  }
  local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ActionMessage::ActionMessage((ActionMessage *)local_e8,cmd_protocol);
  local_e8._4_4_ = 299;
  __src = (byte *)(this->super_NetworkCommsInterface).super_CommsInterface.name._M_dataplus._M_p;
  local_a8.bufferSize =
       (this->super_NetworkCommsInterface).super_CommsInterface.name._M_string_length;
  if ((local_a8.heap != __src) &&
     (SmallBuffer::reserve(&local_a8,local_a8.bufferSize), local_a8.bufferSize != 0)) {
    memcpy(local_a8.heap,__src,local_a8.bufferSize);
  }
  pcVar1 = (this->super_NetworkCommsInterface).super_CommsInterface.brokerName._M_dataplus._M_p;
  sVar2 = (this->super_NetworkCommsInterface).super_CommsInterface.brokerName._M_string_length;
  pcVar4 = (this->super_NetworkCommsInterface).super_CommsInterface.brokerInitString._M_dataplus.
           _M_p;
  sVar3 = (this->super_NetworkCommsInterface).super_CommsInterface.brokerInitString._M_string_length
  ;
  NetworkCommsInterface::getAddress_abi_cxx11_(local_198,&this->super_NetworkCommsInterface);
  local_138 = local_198[0]._M_string_length;
  pcStack_130 = local_198[0]._M_dataplus._M_p;
  string3._M_str = local_198[0]._M_dataplus._M_p;
  string3._M_len = local_198[0]._M_string_length;
  string1._M_str = pcVar1;
  string1._M_len = sVar2;
  string2._M_str = pcVar4;
  string2._M_len = sVar3;
  ActionMessage::setStringData((ActionMessage *)local_e8,string1,string2,string3);
  __flags = (int)pcVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p != &local_198[0].field_2) {
    operator_delete(local_198[0]._M_dataplus._M_p,local_198[0].field_2._M_allocated_capacity + 1);
  }
  ActionMessage::to_vector((ActionMessage *)local_e8,&local_1b8);
  zmq::detail::socket_base::send
            (&brokerConnection->super_socket_base,
             (int)local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,
             local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish +
             -(long)local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,1,__flags);
  ActionMessage::~ActionMessage((ActionMessage *)local_e8);
  if (local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int ZmqCommsSS::initializeConnectionToBroker(zmq::socket_t& brokerConnection)
{
    brokerConnection.setsockopt(ZMQ_IDENTITY, name.c_str(), name.size());
    brokerConnection.setsockopt(ZMQ_LINGER, 500);
    try {
        brokerConnection.connect(
            gmlc::networking::makePortAddress(brokerTargetAddress, brokerPort));
    }
    catch (zmq::error_t& ze) {
        logError(std::string("unable to connect with broker at ") +
                 gmlc::networking::makePortAddress(brokerTargetAddress, brokerPort + 1) + ":(" +
                 name + ")" + ze.what());
        setTxStatus(ConnectionStatus::ERRORED);
        return -1;
    }
    std::vector<char> buffer;
    // generate a local protocol connection string to send it's identity
    ActionMessage cmessage(CMD_PROTOCOL);
    cmessage.messageID = CONNECTION_INFORMATION;
    cmessage.name(name);
    cmessage.setStringData(brokerName, brokerInitString, getAddress());
    cmessage.to_vector(buffer);
    brokerConnection.send(zmq::const_buffer(buffer.data(), buffer.size()),
                          zmq::send_flags::dontwait);
    return 0;
}